

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

bool __thiscall
google::protobuf::EnumOptions::MergePartialFromCodedStream
          (EnumOptions *this,CodedInputStream *input)

{
  Message *containing_type;
  bool bVar1;
  uint32 uVar2;
  int iVar3;
  WireType WVar4;
  UninterpretedOption *value;
  UnknownFieldSet *pUVar5;
  uint32 tag;
  CodedInputStream *input_local;
  EnumOptions *this_local;
  uint32 local_48;
  uint32 local_24;
  bool *pbStack_20;
  uint32 temp;
  CodedInputStream *local_18;
  undefined1 local_9;
  
  do {
    while( true ) {
      if ((input->buffer_ < input->buffer_end_) && (*input->buffer_ < 0x80)) {
        input->last_tag_ = (uint)*input->buffer_;
        io::CodedInputStream::Advance(input,1);
        local_48 = input->last_tag_;
      }
      else {
        uVar2 = io::CodedInputStream::ReadTagFallback(input);
        input->last_tag_ = uVar2;
        local_48 = input->last_tag_;
      }
      if (local_48 == 0) {
        return true;
      }
      iVar3 = internal::WireFormatLite::GetTagFieldNumber(local_48);
      if (iVar3 != 2) break;
      WVar4 = internal::WireFormatLite::GetTagWireType(local_48);
      if (WVar4 == WIRETYPE_VARINT) {
        pbStack_20 = &this->allow_alias_;
        local_18 = input;
        local_9 = io::CodedInputStream::ReadVarint32(input,&local_24);
        if (!(bool)local_9) {
          return false;
        }
        *pbStack_20 = local_24 != 0;
        set_has_allow_alias(this);
        iVar3 = io::CodedInputStream::BufferSize(input);
        if (((iVar3 < 2) || (*input->buffer_ != 0xba)) || (input->buffer_[1] != '>')) {
          bVar1 = false;
        }
        else {
          io::CodedInputStream::Advance(input,2);
          bVar1 = true;
        }
        if (bVar1) goto LAB_00304743;
      }
      else {
LAB_00304890:
        WVar4 = internal::WireFormatLite::GetTagWireType(local_48);
        containing_type = default_instance_;
        if (WVar4 == WIRETYPE_END_GROUP) {
          return true;
        }
        if (local_48 < 8000) {
          pUVar5 = mutable_unknown_fields(this);
          bVar1 = internal::WireFormat::SkipField(input,local_48,pUVar5);
          if (!bVar1) {
            return false;
          }
        }
        else {
          pUVar5 = mutable_unknown_fields(this);
          bVar1 = internal::ExtensionSet::ParseField
                            (&this->_extensions_,local_48,input,containing_type,pUVar5);
          if (!bVar1) {
            return false;
          }
        }
      }
    }
    if ((iVar3 != 999) ||
       (WVar4 = internal::WireFormatLite::GetTagWireType(local_48),
       WVar4 != WIRETYPE_LENGTH_DELIMITED)) goto LAB_00304890;
LAB_00304743:
    do {
      value = add_uninterpreted_option(this);
      bVar1 = internal::WireFormatLite::ReadMessageNoVirtual<google::protobuf::UninterpretedOption>
                        (input,value);
      if (!bVar1) {
        return false;
      }
      iVar3 = io::CodedInputStream::BufferSize(input);
      if (((iVar3 < 2) || (*input->buffer_ != 0xba)) || (input->buffer_[1] != '>')) {
        bVar1 = false;
      }
      else {
        io::CodedInputStream::Advance(input,2);
        bVar1 = true;
      }
    } while (bVar1);
    bVar1 = io::CodedInputStream::ExpectAtEnd(input);
    if (bVar1) {
      return true;
    }
  } while( true );
}

Assistant:

bool EnumOptions::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!(EXPRESSION)) return false
  ::google::protobuf::uint32 tag;
  while ((tag = input->ReadTag()) != 0) {
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional bool allow_alias = 2 [default = true];
      case 2: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_VARINT) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &allow_alias_)));
          set_has_allow_alias();
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(7994)) goto parse_uninterpreted_option;
        break;
      }

      // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
      case 999: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_uninterpreted_option:
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_uninterpreted_option()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(7994)) goto parse_uninterpreted_option;
        if (input->ExpectAtEnd()) return true;
        break;
      }

      default: {
      handle_uninterpreted:
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          return true;
        }
        if ((8000u <= tag)) {
          DO_(_extensions_.ParseField(tag, input, default_instance_,
                                      mutable_unknown_fields()));
          continue;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
  return true;
#undef DO_
}